

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

bool __thiscall
GGSock::Serialize::operator()
          (Serialize *this,
          map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
          *t,SerializationBuffer *buffer,size_t *offset)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  int32_t n;
  int32_t local_34;
  
  local_34 = (int32_t)(t->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  bVar1 = operator()(this,&local_34,buffer,offset);
  for (p_Var4 = (t->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(t->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    bVar2 = operator()(this,(int32_t *)(p_Var4 + 1),buffer,offset);
    bVar3 = operator()(this,(FileInfo *)&p_Var4[1]._M_parent,buffer,offset);
    bVar1 = (bool)(bVar1 & (bVar3 && bVar2));
  }
  return bVar1;
}

Assistant:

bool Serialize::operator()(const std::map<Key, Value> & t, SerializationBuffer & buffer, size_t & offset) {
    bool res = true;

    int32_t n = (int32_t) t.size();
    res &= operator()(n, buffer, offset);
    for (const auto & p : t) {
        res &= operator()(p.first, buffer, offset);
        res &= operator()(p.second, buffer, offset);
    }

    return res;
}